

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DashTests.cpp
# Opt level: O1

void __thiscall agge::tests::DashTests::SegmentAreOutputtedAsIsIfDashIsLong(DashTests *this)

{
  point reference2 [4];
  point reference1 [3];
  dash d;
  undefined1 local_168 [8];
  int local_160;
  undefined8 local_15c;
  undefined4 local_154;
  undefined8 local_150;
  int local_148;
  pointer local_144;
  int local_13c;
  undefined1 local_138 [8];
  int iStack_130;
  real_t rStack_12c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  undefined1 auStack_100 [16];
  point apStack_f0 [2];
  pointer local_d8;
  int local_d0;
  pointer local_cc;
  int local_c4;
  pointer local_c0;
  int local_b8;
  dash local_b0;
  string local_58;
  LocationInfo local_38;
  
  dash::dash(&local_b0);
  dash::add_dash(&local_b0,6.0,1.0);
  dash::add_vertex(&local_b0,1.1,17.0,1);
  dash::add_vertex(&local_b0,4.1,13.0,2);
  local_160 = 0;
  local_168 = (undefined1  [8])0x0;
  local_d0 = dash::vertex(&local_b0,(real_t *)local_168,(real_t *)(local_168 + 4));
  local_d8 = (pointer)local_168;
  local_160 = 0;
  local_168 = (undefined1  [8])0x0;
  local_c4 = dash::vertex(&local_b0,(real_t *)local_168,(real_t *)(local_168 + 4));
  local_cc = (pointer)local_168;
  local_160 = 0;
  local_168 = (undefined1  [8])0x0;
  local_b8 = dash::vertex(&local_b0,(real_t *)local_168,(real_t *)(local_168 + 4));
  local_c0 = (pointer)local_168;
  apStack_f0[0].x = 0.0;
  apStack_f0[0].y = 0.0;
  apStack_f0[0].command = 0;
  local_108._0_4_ = 1.1;
  local_108._4_4_ = 17.0;
  auStack_100._0_4_ = 1;
  auStack_100._4_4_ = 4.1;
  auStack_100._8_4_ = 13.0;
  auStack_100._12_4_ = 2;
  local_138 = (undefined1  [8])&local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_138,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo((LocationInfo *)local_168,(string *)local_138,0x21);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,3ul>
            ((point (*) [3])local_108,(point (*) [3])&local_d8,(LocationInfo *)local_168);
  if (local_168 != (undefined1  [8])((long)&local_15c + 4)) {
    operator_delete((void *)local_168);
  }
  if (local_138 != (undefined1  [8])&local_128) {
    operator_delete((void *)local_138);
  }
  dash::remove_all(&local_b0);
  dash::add_vertex(&local_b0,1.0,1.0,1);
  dash::add_vertex(&local_b0,2.5,3.0,2);
  dash::add_vertex(&local_b0,2.7,3.1,2);
  iStack_130 = 0;
  local_138 = (undefined1  [8])0x0;
  local_160 = dash::vertex(&local_b0,(real_t *)local_138,(real_t *)(local_138 + 4));
  local_168 = local_138;
  iStack_130 = 0;
  local_138 = (undefined1  [8])0x0;
  local_154 = dash::vertex(&local_b0,(real_t *)local_138,(real_t *)(local_138 + 4));
  local_15c = (pointer)local_138;
  iStack_130 = 0;
  local_138 = (undefined1  [8])0x0;
  local_148 = dash::vertex(&local_b0,(real_t *)local_138,(real_t *)(local_138 + 4));
  local_150 = local_138;
  iStack_130 = 0;
  local_138 = (undefined1  [8])0x0;
  local_13c = dash::vertex(&local_b0,(real_t *)local_138,(real_t *)(local_138 + 4));
  local_144 = (pointer)local_138;
  local_118._0_4_ = 2;
  local_118._4_4_ = 0.0;
  local_118._8_4_ = 0.0;
  local_118._12_4_ = 0;
  local_128._M_allocated_capacity = 0x240400000;
  local_128._8_8_ = 0x40466666402ccccd;
  local_138 = (undefined1  [8])0x3f8000003f800000;
  iStack_130 = 1;
  rStack_12c = 2.5;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/DashTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_38,&local_58,0x32);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,4ul>
            ((point (*) [4])local_138,(point (*) [4])local_168,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.filename._M_dataplus._M_p != &local_38.filename.field_2) {
    operator_delete(local_38.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_b0._pattern._begin != (dash_gap *)0x0) {
    operator_delete__(local_b0._pattern._begin);
  }
  if (local_b0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin != (vertex *)0x0) {
    operator_delete__(local_b0.super_vertex_sequence.super_pod_vector<agge::vertex>._begin);
  }
  return;
}

Assistant:

test( SegmentAreOutputtedAsIsIfDashIsLong )
			{
				// INIT
				dash d;

				// INIT / ACT
				d.add_dash(6.0f, 1.0f);

				// ACT
				move_to(d, 1.1f, 17.0f);
				line_to(d, 4.1f, 13.0f);
				mocks::path::point result1[] = { vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference1[] = {
					{ 1.1f, 17.0f, path_command_move_to },
					{ 4.1f, 13.0f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference1, result1);

				// ACT
				d.remove_all();
				move_to(d, 1.0f, 1.0f);
				line_to(d, 2.5f, 3.0f);
				line_to(d, 2.7f, 3.1f);
				mocks::path::point result2[] = { vertex(d), vertex(d), vertex(d), vertex(d), };

				// ASSERT
				mocks::path::point reference2[] = {
					{ 1.0f, 1.0f, path_command_move_to },
					{ 2.5f, 3.0f, path_command_line_to },
					{ 2.7f, 3.1f, path_command_line_to },
					{ 0.0f, 0.0f, path_command_stop },
				};

				assert_equal(reference2, result2);
			}